

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 207_courseSchedule.cpp
# Opt level: O2

int main(void)

{
  initializer_list<int> __l;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_00;
  allocator_type local_51;
  _Vector_base<int,_std::allocator<int>_> local_50;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  vv;
  vector<int,_std::allocator<int>_> v;
  
  vv.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  __l._M_len = 2;
  __l._M_array = (iterator)&vv;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,(allocator_type *)&local_50);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&local_50,&v);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_50;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&vv,__l_00,&local_51);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  canFinish(2,&vv);
  std::ostream::_M_insert<bool>(true);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&vv);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main()
{
	vector<int> v = {1,0};
	vector<vector<int>> vv{v};
	cout<<canFinish(2,vv);
}